

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O0

void __thiscall TreeNode::~TreeNode(TreeNode *this)

{
  TreeNode *in_RDI;
  
  ~TreeNode(in_RDI);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

virtual ~TreeNode() { removeElements(); }